

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O0

Expression *
slang::ast::ClockingEventExpression::fromSyntax
          (ClockingPropertyExprSyntax *syntax,ASTContext *argContext)

{
  int iVar1;
  Compilation *this;
  TimingControlSyntax *pTVar2;
  undefined4 extraout_var;
  Type *args_2;
  ClockingEventExpression *pCVar3;
  socklen_t __len;
  void *in_RSI;
  long in_RDI;
  SourceRange SVar4;
  SourceRange SVar5;
  TimingControl *timing;
  Compilation *comp;
  ASTContext context;
  ASTContext *in_stack_ffffffffffffff78;
  SourceLocation in_stack_ffffffffffffff80;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffffb0;
  ASTContext local_48;
  long local_8;
  TimingControl *args_1;
  
  local_8 = in_RDI;
  memcpy(&local_48,in_RSI,0x38);
  ASTContext::clearInstanceAndProc(&local_48);
  bitmask<slang::ast::ASTFlags>::bitmask
            ((bitmask<slang::ast::ASTFlags> *)&stack0xffffffffffffffb0,NonProcedural);
  bitmask<slang::ast::ASTFlags>::operator|=
            (&local_48.flags,(bitmask<slang::ast::ASTFlags> *)&stack0xffffffffffffffb0);
  this = ASTContext::getCompilation((ASTContext *)0xa1f194);
  pTVar2 = not_null<slang::syntax::TimingControlSyntax_*>::operator*
                     ((not_null<slang::syntax::TimingControlSyntax_*> *)0xa1f1aa);
  iVar1 = TimingControl::bind((int)pTVar2,(sockaddr *)&local_48,__len);
  args_1 = (TimingControl *)CONCAT44(extraout_var,iVar1);
  if (*(long *)(local_8 + 0x20) != 0) {
    SVar4 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_ffffffffffffffb0.m_bits);
    SVar5.endLoc = SVar4.startLoc;
    SVar5.startLoc = in_stack_ffffffffffffff80;
    ASTContext::addDiag(in_stack_ffffffffffffff78,SVar4.endLoc._4_4_,SVar5);
  }
  args_2 = Compilation::getVoidType(this);
  SVar5 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_ffffffffffffffb0.m_bits);
  pCVar3 = BumpAllocator::
           emplace<slang::ast::ClockingEventExpression,slang::ast::Type_const&,slang::ast::TimingControl&,slang::SourceRange>
                     ((BumpAllocator *)SVar5.endLoc,(Type *)SVar5.startLoc,args_1,
                      (SourceRange *)args_2);
  return &pCVar3->super_Expression;
}

Assistant:

Expression& ClockingEventExpression::fromSyntax(const ClockingPropertyExprSyntax& syntax,
                                                const ASTContext& argContext) {
    // Clocking event expressions are only used in special system function calls,
    // where they don't actually pass any time but instead tell the function which
    // clock to use. We don't want usage inside of an always_comb to report an error
    // about passing time, so clear out the context's procedure to avoid that.
    ASTContext context(argContext);
    context.clearInstanceAndProc();
    context.flags |= ASTFlags::NonProcedural;

    auto& comp = context.getCompilation();
    auto& timing = TimingControl::bind(*syntax.event, context);

    if (syntax.expr)
        context.addDiag(diag::UnexpectedClockingExpr, syntax.expr->sourceRange());

    return *comp.emplace<ClockingEventExpression>(comp.getVoidType(), timing, syntax.sourceRange());
}